

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_order_executed_with_price *m)

{
  bool bVar1;
  __uint32_t _Var2;
  trade_sign sign;
  ulong size;
  order_book *ob_00;
  order_book *this_00;
  pointer ppVar3;
  long in_RSI;
  itch50_handler *in_RDI;
  trade t;
  execution result;
  order_book *ob;
  uint64_t timestamp;
  uint64_t price;
  uint64_t quantity;
  iterator it;
  undefined4 in_stack_fffffffffffffed8;
  event_mask in_stack_fffffffffffffedc;
  execution *e;
  side_type s;
  undefined8 in_stack_ffffffffffffff20;
  trade local_80;
  uint64_t in_stack_ffffffffffffffb0;
  order_book *this_01;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_28;
  ulong local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_18;
  long local_10;
  
  s = (side_type)((ulong)in_stack_ffffffffffffff20 >> 0x18);
  local_20 = (ulong)*(ushort *)(in_RSI + 1);
  local_10 = in_RSI;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::find((unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
               *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(key_type *)0x145f69)
  ;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::end((unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  bVar1 = std::__detail::operator!=(&local_18,&local_28);
  if (bVar1) {
    _Var2 = __bswap_32(*(__uint32_t *)(local_10 + 0x13));
    size = (ulong)_Var2;
    _Var2 = __bswap_32(*(__uint32_t *)(local_10 + 0x20));
    ob_00 = (order_book *)(ulong)_Var2;
    this_00 = (order_book *)itch50_timestamp(0x145ff6);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>
                         *)0x14600b);
    this_01 = &ppVar3->second;
    e = (execution *)&stack0xffffffffffffffa0;
    order_book::execute(this_00,(uint64_t)this_01,in_stack_ffffffffffffffb0);
    order_book::set_timestamp(this_01,(uint64_t)this_00);
    sign = itch50_trade_sign(s);
    trade::trade(&local_80,(uint64_t)this_00,(uint64_t)ob_00,size,sign);
    order_book::symbol_abi_cxx11_(this_01);
    sweep_event(in_RDI,e);
    make_event((string *)e,size,ob_00,(trade *)this_00,in_stack_fffffffffffffedc);
    std::function<void_(const_helix::event_&)>::operator()
              ((function<void_(const_helix::event_&)> *)this_00,
               (event *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    event::~event((event *)0x14612e);
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_order_executed_with_price* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        uint64_t quantity = be32toh(m->ExecutedShares);
        uint64_t price = be32toh(m->ExecutionPrice);
        uint64_t timestamp = itch50_timestamp(m->Timestamp);
        auto& ob = it->second;
        auto result = ob.execute(m->OrderReferenceNumber, quantity);
        ob.set_timestamp(timestamp);
        trade t{timestamp, price, quantity, itch50_trade_sign(result.side)};
        _process_event(make_event(ob.symbol(), timestamp, &ob, &t, sweep_event(result)));
    }
}